

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fadop.h
# Opt level: O1

int __thiscall
FadBinaryMinus<FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadBinaryMinus<FadCst<int>,_FadExpr<FadBinaryDiv<Fad<double>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>_>_>_>_>_>_>_>_>,_FadExpr<FadBinaryMul<FadCst<int>,_Fad<double>_>_>_>
::size(FadBinaryMinus<FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadBinaryMinus<FadCst<int>,_FadExpr<FadBinaryDiv<Fad<double>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>_>_>_>_>_>_>_>_>,_FadExpr<FadBinaryMul<FadCst<int>,_Fad<double>_>_>_>
       *this)

{
  int iVar1;
  int iVar2;
  int iVar3;
  FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadBinaryMinus<FadCst<int>,_FadExpr<FadBinaryDiv<Fad<double>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>_>_>_>_>_>_>
  *pFVar4;
  FadExpr<FadBinaryDiv<Fad<double>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>_>_>
  *pFVar5;
  FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>
  *pFVar6;
  int iVar7;
  
  pFVar4 = (this->left_->fadexpr_).right_;
  iVar1 = (((((this->left_->fadexpr_).left_)->fadexpr_).right_)->dx_).num_elts;
  iVar2 = (((pFVar4->fadexpr_).left_)->dx_).num_elts;
  pFVar5 = (((pFVar4->fadexpr_).right_)->fadexpr_).right_;
  pFVar6 = (pFVar5->fadexpr_).right_;
  iVar3 = (((((pFVar6->fadexpr_).left_)->fadexpr_).right_)->dx_).num_elts;
  iVar7 = (((((pFVar6->fadexpr_).right_)->fadexpr_).right_)->dx_).num_elts;
  if (iVar7 < iVar3) {
    iVar7 = iVar3;
  }
  iVar3 = (((pFVar5->fadexpr_).left_)->dx_).num_elts;
  if (iVar7 < iVar3) {
    iVar7 = iVar3;
  }
  if (iVar7 < iVar2) {
    iVar7 = iVar2;
  }
  if (iVar7 < iVar1) {
    iVar7 = iVar1;
  }
  iVar1 = (((this->right_->fadexpr_).right_)->dx_).num_elts;
  if (iVar7 <= iVar1) {
    iVar7 = iVar1;
  }
  return iVar7;
}

Assistant:

int size() const {
    int lsz = left_.size(), rsz = right_.size();
    return std::max(lsz, rsz);
  }